

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

void __thiscall winmd::reader::database::database(database *this,string_view *path,cache *cache)

{
  cache *__t;
  allocator<char> local_2d [13];
  cache *local_20;
  cache *cache_local;
  string_view *path_local;
  database *this_local;
  
  local_20 = cache;
  cache_local = (cache *)path;
  path_local = (string_view *)this;
  table<winmd::reader::TypeRef>::table(&this->TypeRef,this);
  table<winmd::reader::GenericParamConstraint>::table(&this->GenericParamConstraint,this);
  table<winmd::reader::TypeSpec>::table(&this->TypeSpec,this);
  table<winmd::reader::TypeDef>::table(&this->TypeDef,this);
  table<winmd::reader::CustomAttribute>::table(&this->CustomAttribute,this);
  table<winmd::reader::MethodDef>::table(&this->MethodDef,this);
  table<winmd::reader::MemberRef>::table(&this->MemberRef,this);
  table<winmd::reader::Module>::table(&this->Module,this);
  table<winmd::reader::Param>::table(&this->Param,this);
  table<winmd::reader::InterfaceImpl>::table(&this->InterfaceImpl,this);
  table<winmd::reader::Constant>::table(&this->Constant,this);
  table<winmd::reader::Field>::table(&this->Field,this);
  table<winmd::reader::FieldMarshal>::table(&this->FieldMarshal,this);
  table<winmd::reader::DeclSecurity>::table(&this->DeclSecurity,this);
  table<winmd::reader::ClassLayout>::table(&this->ClassLayout,this);
  table<winmd::reader::FieldLayout>::table(&this->FieldLayout,this);
  table<winmd::reader::StandAloneSig>::table(&this->StandAloneSig,this);
  table<winmd::reader::EventMap>::table(&this->EventMap,this);
  table<winmd::reader::Event>::table(&this->Event,this);
  table<winmd::reader::PropertyMap>::table(&this->PropertyMap,this);
  table<winmd::reader::Property>::table(&this->Property,this);
  table<winmd::reader::MethodSemantics>::table(&this->MethodSemantics,this);
  table<winmd::reader::MethodImpl>::table(&this->MethodImpl,this);
  table<winmd::reader::ModuleRef>::table(&this->ModuleRef,this);
  table<winmd::reader::ImplMap>::table(&this->ImplMap,this);
  table<winmd::reader::FieldRVA>::table(&this->FieldRVA,this);
  table<winmd::reader::Assembly>::table(&this->Assembly,this);
  table<winmd::reader::AssemblyProcessor>::table(&this->AssemblyProcessor,this);
  table<winmd::reader::AssemblyOS>::table(&this->AssemblyOS,this);
  table<winmd::reader::AssemblyRef>::table(&this->AssemblyRef,this);
  table<winmd::reader::AssemblyRefProcessor>::table(&this->AssemblyRefProcessor,this);
  table<winmd::reader::AssemblyRefOS>::table(&this->AssemblyRefOS,this);
  table<winmd::reader::File>::table(&this->File,this);
  table<winmd::reader::ExportedType>::table(&this->ExportedType,this);
  table<winmd::reader::ManifestResource>::table(&this->ManifestResource,this);
  table<winmd::reader::NestedClass>::table(&this->NestedClass,this);
  table<winmd::reader::GenericParam>::table(&this->GenericParam,this);
  table<winmd::reader::MethodSpec>::table(&this->MethodSpec,this);
  cppwinrt::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->m_buffer);
  file_view::file_view(&this->m_view,(string_view *)cache_local);
  __t = cache_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->m_path,(basic_string_view<char,_std::char_traits<char>_> *)__t,
             local_2d);
  std::allocator<char>::~allocator(local_2d);
  byte_view::byte_view(&this->m_strings);
  byte_view::byte_view(&this->m_blobs);
  byte_view::byte_view(&this->m_guids);
  this->m_cache = local_20;
  initialize(this);
  return;
}

Assistant:

explicit database(std::string_view const& path, cache const* cache = nullptr) : m_view{ path }, m_path{ path }, m_cache{ cache }
        {
            initialize();
        }